

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynDoWhile * ParseDoWhile(ParseContext *ctx)

{
  bool bVar1;
  SynBase *pSVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  IntrusiveList<SynBase> IVar5;
  SynBase *local_50;
  SynBase *condition;
  SynBase *body;
  SynBase *local_38;
  undefined1 local_30 [8];
  IntrusiveList<SynBase> expressions;
  Lexeme *start;
  ParseContext *ctx_local;
  
  expressions.tail = (SynBase *)ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_do);
  if (bVar1) {
    IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)local_30);
    bVar1 = ParseContext::Consume(ctx,lex_ofigure);
    if (bVar1) {
      IVar5 = ParseExpressions(ctx);
      body = IVar5.head;
      local_30 = (undefined1  [8])body;
      local_38 = IVar5.tail;
      expressions.head = local_38;
      anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    }
    else {
      pSVar2 = ParseExpression(ctx);
      if (pSVar2 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar3,"ERROR: expression expected after \'do\'");
        pSVar2 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        pLVar4 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)pSVar2,pLVar3,pLVar4);
        IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)local_30,pSVar2);
      }
      else {
        IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)local_30,pSVar2);
      }
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_while,"ERROR: \'while\' expected after \'do\' statement");
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'while\'");
    local_50 = ParseAssignment(ctx);
    if (local_50 == (SynBase *)0x0) {
      pLVar3 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report(ctx,pLVar3,"ERROR: expression expected after \'while(\'");
      local_50 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar3 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_50,pLVar3,pLVar4);
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'while\' statement");
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_semicolon,"ERROR: while(...) should be followed by \';\'");
    ctx_local = (ParseContext *)ParseContext::get<SynDoWhile>(ctx);
    pSVar2 = expressions.tail;
    pLVar3 = ParseContext::Previous(ctx);
    IVar5.tail = expressions.head;
    IVar5.head = (SynBase *)local_30;
    SynDoWhile::SynDoWhile((SynDoWhile *)ctx_local,(Lexeme *)pSVar2,pLVar3,IVar5,local_50);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynDoWhile *)ctx_local;
}

Assistant:

SynDoWhile* ParseDoWhile(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_do))
	{
		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
		}
		else if(SynBase *body = ParseExpression(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'do'");

			expressions.push_back(new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current()));
		}

		CheckConsume(ctx, lex_while, "ERROR: 'while' expected after 'do' statement");

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'while'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'while('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'while' statement");

		CheckConsume(ctx, lex_semicolon, "ERROR: while(...) should be followed by ';'");

		return new (ctx.get<SynDoWhile>()) SynDoWhile(start, ctx.Previous(), expressions, condition);
	}

	return NULL;
}